

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_coin_selection.cpp
# Opt level: O0

void __thiscall
CoinSelection_SelectCoins_Error_empty_utxo_Test::TestBody
          (CoinSelection_SelectCoins_Error_empty_utxo_Test *this)

{
  bool bVar1;
  mapped_type *pmVar2;
  Amount AVar3;
  CfdException *anon_var_0;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> ret;
  CoinSelectionOption option;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  map_searched_bnb;
  Amount tx_fee;
  Amount fee;
  AmountMap map_select_value;
  AmountMap map_target_amount;
  CoinSelectionOption *in_stack_000004f8;
  UtxoFilter *in_stack_00000500;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *in_stack_00000508;
  AmountMap *in_stack_00000510;
  CoinSelection *in_stack_00000518;
  Amount *in_stack_00000530;
  AmountMap *in_stack_00000538;
  Amount *in_stack_00000540;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  *in_stack_00000548;
  AmountMap *in_stack_00000550;
  ConfidentialAssetId *in_stack_fffffffffffffdd8;
  CoinSelectionOption *in_stack_fffffffffffffde0;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *__x;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *in_stack_fffffffffffffdf0;
  key_type *in_stack_fffffffffffffe18;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  *in_stack_fffffffffffffe20;
  AssertHelper local_1d8;
  Message local_1d0 [3];
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  byte local_181;
  ConstCharPtr local_180 [17];
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> local_f8 [2];
  int64_t local_c8;
  undefined1 local_c0;
  int64_t local_b8;
  undefined1 local_b0;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> local_a8 [3];
  string local_58 [2];
  
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
         *)0x27c44c);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(local_58,&exp_dummy_asset_a);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
           ::operator[](in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  *pmVar2 = 100000000;
  std::__cxx11::string::~string((string *)local_58);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
         *)0x27c4a4);
  cfd::core::Amount::Amount((Amount *)local_a8);
  AVar3 = cfd::core::Amount::CreateBySatoshiAmount(0x5dc);
  local_c8 = AVar3.amount_;
  local_c0 = AVar3.ignore_check_;
  local_b8 = local_c8;
  local_b0 = local_c0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
         *)0x27c50b);
  GetElementsOption();
  cfd::CoinSelectionOption::SetFeeAsset(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::vector
            ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)0x27c53d);
  testing::internal::ConstCharPtr::ConstCharPtr(local_180,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool(local_180);
  if (bVar1) {
    local_181 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_1b8 = 0;
      uStack_1b0 = 0;
      local_1a8 = 0;
      std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::vector
                ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)0x27c5b6);
      in_stack_fffffffffffffdf0 = local_f8;
      __x = local_a8;
      cfd::CoinSelection::SelectCoins
                (in_stack_00000518,in_stack_00000510,in_stack_00000508,in_stack_00000500,
                 in_stack_000004f8,in_stack_00000530,in_stack_00000538,in_stack_00000540,
                 in_stack_00000548,in_stack_00000550);
      std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::operator=(in_stack_fffffffffffffdf0,__x);
      std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~vector(in_stack_fffffffffffffdf0);
      std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~vector(in_stack_fffffffffffffdf0);
    }
    if ((local_181 & 1) != 0) goto LAB_0027c846;
    local_180[0].value =
         "Expected: ret = exp_selection.SelectCoins( map_target_amount, std::vector<Utxo>(), exp_filter, option, tx_fee, &map_select_value, &fee, &map_searched_bnb) throws an exception of type CfdException.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_1d0);
  testing::internal::AssertHelper::AssertHelper
            (&local_1d8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
             ,0x5e6,local_180[0].value);
  testing::internal::AssertHelper::operator=(&local_1d8,local_1d0);
  testing::internal::AssertHelper::~AssertHelper(&local_1d8);
  testing::Message::~Message((Message *)0x27c804);
LAB_0027c846:
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~vector(in_stack_fffffffffffffdf0);
  cfd::CoinSelectionOption::~CoinSelectionOption((CoinSelectionOption *)0x27c860);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
          *)0x27c86d);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
          *)0x27c87a);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
          *)0x27c887);
  return;
}

Assistant:

TEST(CoinSelection, SelectCoins_Error_empty_utxo) {
  AmountMap map_target_amount;
  map_target_amount[exp_dummy_asset_a.GetHex()] = 100000000;
  AmountMap map_select_value;
  Amount fee;
  Amount tx_fee = Amount::CreateBySatoshiAmount(1500);
  std::map<std::string, bool> map_searched_bnb;
  CoinSelectionOption option = GetElementsOption();
  option.SetFeeAsset(exp_dummy_asset_a);
  std::vector<Utxo> ret;
  EXPECT_THROW(ret = exp_selection.SelectCoins(
      map_target_amount, std::vector<Utxo>(), exp_filter, option,
      tx_fee, &map_select_value, &fee, &map_searched_bnb), CfdException);
}